

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.hpp
# Opt level: O0

CSharedMemoryObjectManager * CorUnix::InternalNew<CorUnix::CSharedMemoryObjectManager>(void)

{
  CSharedMemoryObjectManager *pMem;
  
  pMem = (CSharedMemoryObjectManager *)InternalMalloc(0x180);
  if (pMem == (CSharedMemoryObjectManager *)0x0) {
    pMem = (CSharedMemoryObjectManager *)0x0;
  }
  else {
    CSharedMemoryObjectManager::CSharedMemoryObjectManager(pMem);
  }
  return pMem;
}

Assistant:

T* InternalNew()
    {
        INTERNAL_NEW_COMMON();
        return new (pMem) T();
    }